

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::JavascriptStringObject::GetItemQuery
          (JavascriptStringObject *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  BOOL BVar1;
  PropertyQueryFlags PVar2;
  JavascriptString *pJVar3;
  Var aValue;
  
  pJVar3 = InternalUnwrap(this);
  aValue = CrossSite::MarshalVar
                     (requestContext,pJVar3,
                      (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
  pJVar3 = VarTo<Js::JavascriptString>(aValue);
  BVar1 = JavascriptString::GetItemAt(pJVar3,index,value);
  if (BVar1 != 0) {
    return Property_Found;
  }
  PVar2 = DynamicObject::GetItemQuery
                    (&this->super_DynamicObject,originalInstance,index,value,requestContext);
  return PVar2;
}

Assistant:

PropertyQueryFlags JavascriptStringObject::GetItemQuery(Var originalInstance, uint32 index, Var* value, ScriptContext* requestContext)
    {
        Var strObject = CrossSite::MarshalVar(requestContext,
          this->InternalUnwrap(), this->GetScriptContext());

        JavascriptString* str = VarTo<JavascriptString>(strObject);
        if (str->GetItemAt(index, value))
        {
            return PropertyQueryFlags::Property_Found;
        }
        return DynamicObject::GetItemQuery(originalInstance, index, value, requestContext);
    }